

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getRSS.h
# Opt level: O0

undefined8 bwtil::getFormattedSpaceUsage_abi_cxx11_(ulint bytes)

{
  ostream *poVar1;
  ulong in_RSI;
  undefined8 in_RDI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  stringstream ss;
  stringstream local_198 [16];
  undefined1 local_188 [376];
  ulong local_10;
  undefined1 extraout_var [56];
  
  local_10 = in_RSI;
  auVar3._0_8_ = std::__cxx11::stringstream::stringstream(local_198);
  auVar3._8_56_ = extraout_var;
  auVar2 = auVar3._0_16_;
  if (local_10 >> 0x1e == 0) {
    if (local_10 >> 0x14 == 0) {
      if (local_10 >> 10 != 0) {
        auVar2 = vcvtusi2sd_avx512f(auVar2,local_10);
        poVar1 = (ostream *)std::ostream::operator<<(local_188,auVar2._0_8_ * 0.0009765625);
        std::operator<<(poVar1," KB");
      }
    }
    else {
      auVar2 = vcvtusi2sd_avx512f(auVar2,local_10);
      poVar1 = (ostream *)std::ostream::operator<<(local_188,auVar2._0_8_ * 9.5367431640625e-07);
      std::operator<<(poVar1," MB");
    }
  }
  else {
    auVar2 = vcvtusi2sd_avx512f(auVar2,local_10);
    poVar1 = (ostream *)std::ostream::operator<<(local_188,auVar2._0_8_ * 9.313225746154785e-10);
    std::operator<<(poVar1," GB");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string getFormattedSpaceUsage(ulint bytes){

	stringstream ss;

	if(bytes/((ulint)1<<30) > 0)
		ss << (double)bytes/((ulint)1<<30) << " GB";
	else if (bytes/((ulint)1<<20) > 0)
		ss << (double)bytes/((ulint)1<<20) << " MB";
	else if (bytes/((ulint)1<<10) > 0)
		ss << (double)bytes/((ulint)1<<10) << " KB";

	return ss.str();

}